

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_row_removal<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
               (void)

{
  Column_settings **this;
  undefined8 uVar1;
  bool bVar2;
  reference this_00;
  lazy_ostream *prev;
  logic_error *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]> local_1f0;
  assertion_result local_1d0;
  basic_cstring<const_char> local_1b8;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188 [2];
  undefined1 local_168 [8];
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  this = &m.matrix_.colSettings_;
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>>
            ();
  this_00 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)this,6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(this_00);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>
              *)local_168,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)this,5);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
  ::erase_empty_row((Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
                     *)local_168,5);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_198);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_188,0x32a,&local_198);
    Gudhi::persistence_matrix::
    Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
    ::get_row((Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
               *)local_168,5);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b8);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a8,0x32a,&local_1b8);
      boost::test_tools::assertion_result::assertion_result(&local_1d0,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_1f0,prev,(char (*) [51])"exception std::logic_error expected but not raised"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_1d0,&local_1f0,&ex,0x32a,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl(&local_1f0);
      boost::test_tools::assertion_result::~assertion_result(&local_1d0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
  ::~Matrix((Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
             *)local_168);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_row_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  columns[6].pop_back();  // empties row 5. Not a legit boundary matrix anymore, but for the test,
                          // should be fine, except for chain.

  Matrix m(columns, 5);

  m.erase_empty_row(5);

  BOOST_CHECK_THROW(m.get_row(5), std::logic_error);
}